

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

int coda_strappend(string *out,char *fmt,...)

{
  long lVar1;
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *__s;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 uStack_8100;
  char local_80f8 [16];
  undefined8 local_80e8;
  undefined8 local_80e0;
  undefined8 local_80d8;
  undefined8 local_80d0;
  undefined8 local_80c8;
  undefined8 local_80b8;
  undefined8 local_80a8;
  undefined8 local_8098;
  undefined8 local_8088;
  undefined8 local_8078;
  undefined8 local_8068;
  undefined8 local_8058;
  char local_8048 [32772];
  int local_44;
  char *pcStack_40;
  int bytes;
  char *BUF;
  va_list ap;
  char *fmt_local;
  string *out_local;
  
  __s = local_80f8;
  if (in_AL != '\0') {
    local_80c8 = in_XMM0_Qa;
    local_80b8 = in_XMM1_Qa;
    local_80a8 = in_XMM2_Qa;
    local_8098 = in_XMM3_Qa;
    local_8088 = in_XMM4_Qa;
    local_8078 = in_XMM5_Qa;
    local_8068 = in_XMM6_Qa;
    local_8058 = in_XMM7_Qa;
  }
  pcStack_40 = local_8048;
  ap[0].overflow_arg_area = local_80f8;
  ap[0]._0_8_ = &stack0x00000008;
  BUF._4_4_ = 0x30;
  BUF._0_4_ = 0x10;
  uStack_8100 = 0x10f540;
  local_80e8 = in_RDX;
  local_80e0 = in_RCX;
  local_80d8 = in_R8;
  local_80d0 = in_R9;
  local_44 = vsnprintf(pcStack_40,0x8000,fmt,&BUF);
  if (0x7fff < local_44) {
    lVar1 = -((long)local_44 + 0x10U & 0xfffffffffffffff0);
    __s = local_80f8 + lVar1;
    ap[0].overflow_arg_area = local_80f8;
    ap[0]._0_8_ = &stack0x00000008;
    BUF._4_4_ = 0x30;
    BUF._0_4_ = 0x10;
    *(undefined8 *)((long)&uStack_8100 + lVar1) = 0x10f5a8;
    pcStack_40 = __s;
    vsnprintf(__s,(long)(local_44 + 1),fmt,&BUF);
  }
  __s[-8] = -0x43;
  __s[-7] = -0xb;
  __s[-6] = '\x10';
  __s[-5] = '\0';
  __s[-4] = '\0';
  __s[-3] = '\0';
  __s[-2] = '\0';
  __s[-1] = '\0';
  std::__cxx11::string::append((char *)out,(ulong)pcStack_40);
  return local_44;
}

Assistant:

int coda_strappend(std::string& out, const char* fmt, ...)
{
	va_list ap;

	char *BUF = (char *) alloca(BUFSZ);
	va_start(ap, fmt);
	int bytes = vsnprintf(BUF, BUFSZ, fmt, ap);
	va_end(ap);

	if (BUFSZ <= bytes)
	{
		BUF = (char *) alloca(bytes + 1);
		va_start(ap, fmt);
		vsnprintf(BUF, bytes + 1, fmt, ap);
		va_end(ap);
	}

	out.append(BUF, bytes);

	return bytes;
}